

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddError
          (DescriptorBuilder *this,string *element_name,Message *descriptor,ErrorLocation location,
          string *error)

{
  LogMessage *this_00;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  LogMessage *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff10;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  if (*(long *)(in_RDI + 0x10) == 0) {
    if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
      internal::LogMessage::LogMessage
                (in_stack_ffffffffffffff10,level,(char *)in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffefc);
      internal::LogMessage::operator<<
                (in_stack_ffffffffffffff00,
                 (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      internal::LogMessage::operator<<
                (in_stack_ffffffffffffff00,
                 (string *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      internal::LogMessage::operator<<
                (in_stack_ffffffffffffff00,
                 (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_ffffffffffffff00,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      internal::LogMessage::~LogMessage((LogMessage *)0x49c953);
    }
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff10,level,(char *)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffefc);
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff00,
               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff00,
               (string *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff00,
               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    this_00 = internal::LogMessage::operator<<
                        (in_stack_ffffffffffffff00,
                         (string *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    internal::LogMessage::~LogMessage((LogMessage *)0x49ca18);
  }
  else {
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))
              (*(long **)(in_RDI + 0x10),in_RDI + 0x38,in_RSI,in_RDX,in_ECX,in_R8);
  }
  *(undefined1 *)(in_RDI + 0x30) = 1;
  return;
}

Assistant:

void DescriptorBuilder::AddError(
    const std::string& element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    const std::string& error) {
  if (error_collector_ == nullptr) {
    if (!had_errors_) {
      GOOGLE_LOG(ERROR) << "Invalid proto descriptor for file \"" << filename_
                 << "\":";
    }
    GOOGLE_LOG(ERROR) << "  " << element_name << ": " << error;
  } else {
    error_collector_->AddError(filename_, element_name, &descriptor, location,
                               error);
  }
  had_errors_ = true;
}